

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

void free_sconv_object(archive_string_conv *sc)

{
  void *in_RDI;
  
  free(*(void **)((long)in_RDI + 8));
  free(*(void **)((long)in_RDI + 0x10));
  archive_string_free((archive_string *)0x11243c);
  if (*(long *)((long)in_RDI + 0x28) != -1) {
    iconv_close(*(iconv_t *)((long)in_RDI + 0x28));
  }
  if (*(long *)((long)in_RDI + 0x30) != -1) {
    iconv_close(*(iconv_t *)((long)in_RDI + 0x30));
  }
  free(in_RDI);
  return;
}

Assistant:

static void
free_sconv_object(struct archive_string_conv *sc)
{
	free(sc->from_charset);
	free(sc->to_charset);
	archive_string_free(&sc->utftmp);
#if HAVE_ICONV
	if (sc->cd != (iconv_t)-1)
		iconv_close(sc->cd);
	if (sc->cd_w != (iconv_t)-1)
		iconv_close(sc->cd_w);
#endif
	free(sc);
}